

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O0

int Col_TrieMapGet(Col_Word map,Col_Word key,Col_Word *valuePtr)

{
  uint local_3c;
  uint local_38;
  uint local_34;
  Col_Word local_30;
  Col_Word entry;
  Col_Word *valuePtr_local;
  Col_Word key_local;
  Col_Word map_local;
  
  if (map == 0) {
    local_34 = 0;
  }
  else {
    if ((map & 0xf) == 0) {
      if ((*(byte *)map & 2) == 0) {
        local_3c = 0xffffffff;
      }
      else {
        local_3c = *(byte *)map & 0xfffffffe;
      }
      local_38 = local_3c;
    }
    else {
      local_38 = immediateWordTypes[map & 0x1f];
    }
    local_34 = local_38;
  }
  if (local_34 == 0xffffffff) {
    local_30 = TrieMapFindEntry(map,key,0,(int *)0x0,(Col_Word *)0x0,(Col_Word *)0x0);
  }
  else if (local_34 == 0x42) {
    local_30 = StringTrieMapFindEntry(map,key,0,(int *)0x0,(Col_Word *)0x0,(Col_Word *)0x0);
  }
  if (local_30 != 0) {
    *valuePtr = *(Col_Word *)(local_30 + 0x18);
  }
  map_local._4_4_ = (uint)(local_30 != 0);
  return map_local._4_4_;
}

Assistant:

int
Col_TrieMapGet(
    Col_Word map,       /*!< Trie map to get entry for. */
    Col_Word key,       /*!< Entry key. Can be any word type, including string,
                             however it must match the actual type used by the
                             map. */

    /*! [out] Returned entry value, if found. */
    Col_Word *valuePtr)
{
    Col_Word entry;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_WORDTRIEMAP,map} */
    TYPECHECK_WORDTRIEMAP(map) return 0;

    switch (WORD_TYPE(map)) {
    case WORD_TYPE_STRTRIEMAP:
        entry = StringTrieMapFindEntry(map, key, 0, NULL, NULL, NULL);
        break;

    case WORD_TYPE_CUSTOM:
        entry = TrieMapFindEntry(map, key, 0, NULL, NULL, NULL);
        break;

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }

    if (entry) {
        ASSERT(WORD_TYPE(entry) == WORD_TYPE_TRIELEAF || WORD_TYPE(entry) == WORD_TYPE_MTRIELEAF);
        *valuePtr = WORD_MAPENTRY_VALUE(entry);
        return 1;
    } else {
        return 0;
    }
}